

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Parser::types_are_logically_equivalent(Parser *this,SPIRType *a,SPIRType *b)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  SPIRType *a_00;
  SPIRType *b_00;
  size_t sVar4;
  bool bVar5;
  
  uVar1 = *(uint *)&(a->super_IVariant).field_0xc;
  if ((((((uVar1 == *(uint *)&(b->super_IVariant).field_0xc) && (a->width == b->width)) &&
        (a->vecsize == b->vecsize)) &&
       ((a->columns == b->columns &&
        (sVar2 = (a->array).super_VectorView<unsigned_int>.buffer_size,
        sVar2 == (b->array).super_VectorView<unsigned_int>.buffer_size)))) &&
      ((sVar2 == 0 ||
       (iVar3 = bcmp((a->array).super_VectorView<unsigned_int>.ptr,
                     (b->array).super_VectorView<unsigned_int>.ptr,sVar2 << 2), iVar3 == 0)))) &&
     ((((uVar1 & 0xfffffffe) != 0x10 || ((a->image).type.id == (b->image).type.id)) &&
      (sVar2 = (a->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               buffer_size,
      sVar2 == (b->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
               buffer_size)))) {
    bVar5 = sVar2 == 0;
    if (!bVar5) {
      sVar4 = 0;
      do {
        a_00 = Variant::get<spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (a->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar4].
                          id);
        b_00 = Variant::get<spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (b->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar4].
                          id);
        bVar5 = types_are_logically_equivalent(this,a_00,b_00);
        if (!bVar5) goto LAB_00348054;
        sVar4 = sVar4 + 1;
        bVar5 = true;
      } while (sVar2 != sVar4);
    }
  }
  else {
LAB_00348054:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Parser::types_are_logically_equivalent(const SPIRType &a, const SPIRType &b) const
{
	if (a.basetype != b.basetype)
		return false;
	if (a.width != b.width)
		return false;
	if (a.vecsize != b.vecsize)
		return false;
	if (a.columns != b.columns)
		return false;
	if (a.array.size() != b.array.size())
		return false;

	size_t array_count = a.array.size();
	if (array_count && memcmp(a.array.data(), b.array.data(), array_count * sizeof(uint32_t)) != 0)
		return false;

	if (a.basetype == SPIRType::Image || a.basetype == SPIRType::SampledImage)
	{
		if (memcmp(&a.image, &b.image, sizeof(SPIRType::Image)) != 0)
			return false;
	}

	if (a.member_types.size() != b.member_types.size())
		return false;

	size_t member_types = a.member_types.size();
	for (size_t i = 0; i < member_types; i++)
	{
		if (!types_are_logically_equivalent(get<SPIRType>(a.member_types[i]), get<SPIRType>(b.member_types[i])))
			return false;
	}

	return true;
}